

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

uint64_t __thiscall fmp4_stream::box::size(box *this)

{
  return (ulong)((uint)this->has_uuid_ * 0x10 + (uint)this->is_large_ * 8) + 8;
}

Assistant:

uint64_t box::size()  const {
		uint64_t l_size = 8;
		if (is_large_)
			l_size += 8;
		if (has_uuid_)
			l_size += 16;
		return l_size;
	}